

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-sec-utils.c
# Opt level: O0

int ndn_asn1_decode_ecdsa_signature
              (uint8_t *encoded_ecdsa_sig,uint32_t encoded_ecdsa_sig_len,uint8_t *decoded_ecdsa_sig,
              uint32_t decoded_ecdsa_sig_buf_len,uint32_t *raw_ecdsa_sig_len)

{
  _Bool _Var1;
  _Bool ok;
  uint32_t *raw_ecdsa_sig_len_local;
  uint32_t decoded_ecdsa_sig_buf_len_local;
  uint8_t *decoded_ecdsa_sig_local;
  uint32_t encoded_ecdsa_sig_len_local;
  uint8_t *encoded_ecdsa_sig_local;
  
  if (decoded_ecdsa_sig_buf_len < 0x40) {
    encoded_ecdsa_sig_local._4_4_ = -0x85;
  }
  else {
    *raw_ecdsa_sig_len = 0x40;
    _Var1 = decodeSignatureBits(encoded_ecdsa_sig,(ulong)encoded_ecdsa_sig_len,decoded_ecdsa_sig);
    encoded_ecdsa_sig_local._4_4_ = -0x88;
    if (_Var1) {
      encoded_ecdsa_sig_local._4_4_ = 0;
    }
  }
  return encoded_ecdsa_sig_local._4_4_;
}

Assistant:

int
ndn_asn1_decode_ecdsa_signature(const uint8_t *encoded_ecdsa_sig, uint32_t encoded_ecdsa_sig_len,
                                uint8_t *decoded_ecdsa_sig, uint32_t decoded_ecdsa_sig_buf_len,
                                uint32_t *raw_ecdsa_sig_len)
{
  if (decoded_ecdsa_sig_buf_len < NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE) {
    return NDN_ASN1_ECDSA_SIG_BUFFER_TOO_SMALL;
  }
  *raw_ecdsa_sig_len = NDN_SEC_ECC_SECP256R1_PUBLIC_KEY_SIZE;

  bool ok = decodeSignatureBits(encoded_ecdsa_sig, encoded_ecdsa_sig_len, decoded_ecdsa_sig);
  return ok ? NDN_SUCCESS : NDN_ASN1_ECDSA_SIG_FAILED_TO_READ_ASN1_INT;
}